

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

int uv__open_cloexec(char *path,int flags)

{
  int iVar1;
  int *piVar2;
  uint in_ESI;
  char *in_RDI;
  int fd;
  int err;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = open(in_RDI,in_ESI | 0x80000);
  if (local_4 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 == 0x16) {
      local_4 = open(in_RDI,in_ESI);
      if (local_4 == -1) {
        piVar2 = __errno_location();
        local_4 = -*piVar2;
      }
      else {
        iVar1 = uv__cloexec(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
        if (iVar1 != 0) {
          uv__close(local_4);
          local_4 = iVar1;
        }
      }
    }
    else {
      piVar2 = __errno_location();
      local_4 = -*piVar2;
    }
  }
  return local_4;
}

Assistant:

static int uv__open_cloexec(const char* path, int flags) {
  int err;
  int fd;

#if defined(__linux__)
  fd = open(path, flags | UV__O_CLOEXEC);
  if (fd != -1)
    return fd;

  if (errno != EINVAL)
    return -errno;

  /* O_CLOEXEC not supported. */
#endif

  fd = open(path, flags);
  if (fd == -1)
    return -errno;

  err = uv__cloexec(fd, 1);
  if (err) {
    uv__close(fd);
    return err;
  }

  return fd;
}